

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

bool __thiscall
flatbuffers::ServiceDef::Deserialize(ServiceDef *this,Parser *parser,Service *service)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  RPCCall *this_00;
  Service *pSVar7;
  ushort uVar8;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  ulong uVar9;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  uint uVar10;
  ulong uVar11;
  unsigned_short vtsize;
  string local_70;
  string local_50;
  
  uVar5 = (ulong)*(ushort *)(service + (4 - (long)*(int *)service));
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,service + (ulong)*(uint *)(service + uVar5) + 4 + uVar5,
             service + (ulong)*(uint *)(service + (ulong)*(uint *)(service + uVar5) + 4 + uVar5 + -4
                                       ) + *(uint *)(service + uVar5) + uVar5 + 4);
  Parser::UnqualifiedName(&local_50,parser,&local_70);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  uVar8 = *(ushort *)(service + -(long)*(int *)service);
  if (6 < uVar8) {
    lVar6 = -(long)*(int *)service;
    uVar5 = (ulong)*(ushort *)(service + lVar6 + 6);
    if ((uVar5 != 0) &&
       (uVar9 = (ulong)*(uint *)(service + uVar5), *(int *)(service + uVar9 + uVar5) != 0)) {
      uVar10 = 0;
      uVar11 = 0;
      do {
        this_00 = (RPCCall *)operator_new(0xd8);
        __s = &(this_00->super_Definition).name.field_2;
        memset(__s,0,200);
        paVar1 = &(this_00->super_Definition).file.field_2;
        p_Var2 = &(this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header;
        pSVar7 = service + uVar9 + uVar5;
        (this_00->super_Definition).name._M_dataplus._M_p = (pointer)__s;
        (this_00->super_Definition).name._M_string_length = 0;
        (this_00->super_Definition).file._M_dataplus._M_p = (pointer)paVar1;
        (this_00->super_Definition).file.field_2._M_local_buf[0] = '\0';
        (this_00->super_Definition).doc_comment.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (this_00->super_Definition).doc_comment.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (this_00->super_Definition).doc_comment.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        *(_Base_ptr *)
         ((long)&(this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header.
                 _M_header + 8) = (_Base_ptr)0x0;
        *(_Rb_tree_header **)
         ((long)&(this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header.
                 _M_header + 0x10) = p_Var2;
        *(_Rb_tree_header **)
         ((long)&(this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header.
                 _M_header + 0x18) = p_Var2;
        (this_00->super_Definition).serialized_location = 0;
        (this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_node_count
             = 0;
        (this_00->super_Definition).attributes.vec.
        super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (this_00->super_Definition).attributes.vec.
        super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (this_00->super_Definition).attributes.vec.
        super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (this_00->super_Definition).generated = false;
        (this_00->super_Definition).index = -1;
        (this_00->super_Definition).refcount = 1;
        if (uVar8 < 7) {
          pSVar7 = (Service *)0x0;
        }
        if (*(uint *)pSVar7 <= uVar11) {
          __assert_fail("i < size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                        ,0xc1,
                        "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::RPCCall>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::RPCCall>, SizeT = unsigned int]"
                       );
        }
        bVar4 = RPCCall::Deserialize
                          (this_00,parser,
                           (RPCCall *)
                           (pSVar7 + (ulong)*(uint *)(pSVar7 + (ulong)uVar10 + 4) + (ulong)uVar10 +
                                     4));
        if (!bVar4) {
LAB_00120ad1:
          SymbolTable<flatbuffers::Value>::~SymbolTable(&(this_00->super_Definition).attributes);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&(this_00->super_Definition).doc_comment);
          pcVar3 = (this_00->super_Definition).file._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != paVar1) {
            operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
          }
          pcVar3 = (this_00->super_Definition).name._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != __s) {
            operator_delete(pcVar3,__s->_M_allocated_capacity + 1);
          }
          operator_delete(this_00,0xd8);
          goto LAB_00120b1f;
        }
        bVar4 = SymbolTable<flatbuffers::RPCCall>::Add(&this->calls,(string *)this_00,this_00);
        if (bVar4) goto LAB_00120ad1;
        uVar11 = uVar11 + 1;
        uVar8 = *(ushort *)(service + -(long)*(int *)service);
        uVar5 = (ulong)*(ushort *)(service + -(long)*(int *)service + 6);
        uVar9 = (ulong)*(uint *)(service + uVar5);
        uVar10 = uVar10 + 4;
      } while (uVar11 < *(uint *)(service + uVar9 + uVar5));
      lVar6 = -(long)*(int *)service;
    }
    if ((8 < uVar8) && (uVar5 = (ulong)*(ushort *)(service + lVar6 + 8), uVar5 != 0)) {
      attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)
              (service + *(uint *)(service + uVar5) + uVar5);
      goto LAB_00120a7d;
    }
  }
  attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0;
LAB_00120a7d:
  bVar4 = DeserializeAttributesCommon(&(this->super_Definition).attributes,parser,attrs);
  if (bVar4) {
    if ((*(ushort *)(service + -(long)*(int *)service) < 0xb) ||
       (uVar5 = (ulong)*(ushort *)(service + (10 - (long)*(int *)service)), uVar5 == 0)) {
      documentation = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0;
    }
    else {
      documentation =
           (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
           (service + *(uint *)(service + uVar5) + uVar5);
    }
    anon_unknown_0::DeserializeDoc(&(this->super_Definition).doc_comment,documentation);
    bVar4 = true;
  }
  else {
LAB_00120b1f:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ServiceDef::Deserialize(Parser &parser,
                             const reflection::Service *service) {
  name = parser.UnqualifiedName(service->name()->str());
  if (service->calls()) {
    for (uoffset_t i = 0; i < service->calls()->size(); ++i) {
      auto call = new RPCCall();
      if (!call->Deserialize(parser, service->calls()->Get(i)) ||
          calls.Add(call->name, call)) {
        delete call;
        return false;
      }
    }
  }
  if (!DeserializeAttributes(parser, service->attributes())) return false;
  DeserializeDoc(doc_comment, service->documentation());
  return true;
}